

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_hdwallet.cpp
# Opt level: O3

ExtPubkey * __thiscall
cfd::core::ExtPubkey::DerivePubkey
          (ExtPubkey *__return_storage_ptr__,ExtPubkey *this,string *string_path)

{
  vector<unsigned_int,_std::allocator<unsigned_int>_> path;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_58;
  string local_40;
  
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"ExtPubkey","");
  ToArrayFromString(&local_58,string_path,&local_40,this->depth_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  DerivePubkey(__return_storage_ptr__,this,&local_58);
  if (local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

ExtPubkey ExtPubkey::DerivePubkey(const std::string& string_path) const {
  std::vector<uint32_t> path =
      ToArrayFromString(string_path, "ExtPubkey", depth_);
  return DerivePubkey(path);
}